

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

int sort_rooms_ring_comp(void *va,void *vb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 local_58;
  undefined4 local_54;
  int byx;
  int ayx;
  int bquad;
  int aquad;
  int by;
  int bx;
  int ay;
  int ax;
  sort_rooms_data *b;
  sort_rooms_data *a;
  void *vb_local;
  void *va_local;
  
  iVar1 = (*(int *)((long)va + 4) + *(int *)((long)va + 0xc) + -0x50) / 2;
  iVar2 = (*(int *)((long)vb + 4) + *(int *)((long)vb + 0xc) + -0x50) / 2;
  iVar3 = (*(int *)((long)va + 8) + *(int *)((long)va + 0x10) + -0x15) / 2;
  iVar4 = (*(int *)((long)vb + 8) + *(int *)((long)vb + 0x10) + -0x15) / 2;
  if (iVar1 < 0) {
    local_54 = 2;
    if (-1 < iVar3) {
      local_54 = 1;
    }
  }
  else {
    local_54 = 3;
    if (-1 < iVar3) {
      local_54 = 0;
    }
  }
  if (iVar2 < 0) {
    local_58 = 2;
    if (-1 < iVar4) {
      local_58 = 1;
    }
  }
  else {
    local_58 = 3;
    if (-1 < iVar4) {
      local_58 = 0;
    }
  }
  if (local_54 == local_58) {
    if ((iVar1 == 0) && (iVar2 == 0)) {
      va_local._4_4_ = sort_rooms_standard_comp(va,vb);
    }
    else if (iVar1 == 0) {
      va_local._4_4_ = -1;
    }
    else if (iVar2 == 0) {
      va_local._4_4_ = 1;
    }
    else {
      iVar1 = (iVar3 * 0x50) / iVar1;
      iVar2 = (iVar4 * 0x50) / iVar2;
      if (iVar1 == iVar2) {
        va_local._4_4_ = sort_rooms_standard_comp(va,vb);
      }
      else if (iVar1 < iVar2) {
        va_local._4_4_ = -1;
      }
      else {
        va_local._4_4_ = 1;
      }
    }
  }
  else {
    va_local._4_4_ = 1;
    if (local_54 < local_58) {
      va_local._4_4_ = -1;
    }
  }
  return va_local._4_4_;
}

Assistant:

static int sort_rooms_ring_comp(const void *va, const void *vb)
{
	const struct sort_rooms_data *a, *b;
	int ax, ay, bx, by;	/* x and y relative to map center */
	int aquad, bquad;	/* quadrants of rooms */

	a = (const struct sort_rooms_data *)va;
	b = (const struct sort_rooms_data *)vb;

	ax = (a->lx + a->hx - COLNO) / 2;
	bx = (b->lx + b->hx - COLNO) / 2;
	ay = (a->ly + a->hy - ROWNO) / 2;
	by = (b->ly + b->hy - ROWNO) / 2;

	/*
	 * Avoid expensive sqrt/atan2 calls by comparing
	 * quadrants and tangents directly.
	 *
	 *  2 | 3
	 * ---+---
	 *  1 | 0
	 */
	aquad = (ax >= 0) ? (ay >= 0 ? 0 : 3) : (ay >= 0 ? 1 : 2);
	bquad = (bx >= 0) ? (by >= 0 ? 0 : 3) : (by >= 0 ? 1 : 2);

	if (aquad != bquad)
	    return (aquad < bquad) ? -1 : 1;

	/* Same quad? Compare tan values: ay/ax vs. by/bx */
	if (ax == 0 && bx == 0) {
	    /* Avoid unstable sort effects across qsort implementations. */
	    return sort_rooms_standard_comp(va, vb);
	} else if (ax == 0) {
	    return -1;
	} else if (bx == 0) {
	    return 1;
	} else {
	    /* COLNO factor (longer level axis) to reduce rounding errors */
	    int ayx = COLNO * ay / ax;
	    int byx = COLNO * by / bx;
	    if (ayx == byx) {
		/* Again, avoid implementation qsort instability. */
		return sort_rooms_standard_comp(va, vb);
	    } else if (ayx < byx) {
		return -1;
	    } else {
		return 1;
	    }
	}
}